

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O3

GLuint __thiscall
gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildShaderProgram
          (ShaderImageLoadStoreBase *this,GLenum type,char *src)

{
  GLuint program;
  CallLogWrapper *this_00;
  GLint status;
  GLchar log [1024];
  char *local_428;
  int local_41c;
  GLchar local_418 [1024];
  
  this_00 = &(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper;
  local_428 = src;
  program = glu::CallLogWrapper::glCreateShaderProgramv(this_00,type,1,&local_428);
  glu::CallLogWrapper::glGetProgramiv(this_00,program,0x8b82,&local_41c);
  if (local_41c == 0) {
    glu::CallLogWrapper::glGetProgramInfoLog(this_00,program,0x400,(GLsizei *)0x0,local_418);
    anon_unknown_0::Output("Program Info Log:\n%s\n%s\n",local_418,local_428);
  }
  return program;
}

Assistant:

GLuint BuildShaderProgram(GLenum type, const char* src)
	{
		const GLuint p = glCreateShaderProgramv(type, 1, &src);

		GLint status;
		glGetProgramiv(p, GL_LINK_STATUS, &status);
		if (status == GL_FALSE)
		{
			GLchar log[1024];
			glGetProgramInfoLog(p, sizeof(log), NULL, log);
			Output("Program Info Log:\n%s\n%s\n", log, src);
		}

		return p;
	}